

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode
DecodeContextMap(uint32_t context_map_size,uint32_t *num_htrees,uint8_t **context_map_arg,
                BrotliDecoderStateInternal *s)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  bool bVar4;
  uint local_23c;
  uint local_238;
  uint32_t bits_1;
  uint32_t reps;
  uint32_t code;
  uint8_t *context_map;
  uint32_t max_run_length_prefix;
  uint32_t context_index;
  uint32_t bits;
  BrotliDecoderErrorCode result;
  BrotliBitReader *br;
  BrotliDecoderStateInternal *s_local;
  uint8_t **context_map_arg_local;
  uint32_t *num_htrees_local;
  uint32_t context_map_size_local;
  undefined4 local_1e4;
  BrotliBitReader *local_1e0;
  int local_1d4;
  uint *local_1d0;
  uint32_t local_1c4;
  BrotliBitReader *local_1c0;
  int local_1b4;
  BrotliBitReader *local_1b0;
  BrotliBitReader *local_1a8;
  uint *local_1a0;
  uint32_t local_194;
  BrotliBitReader *local_190;
  uint32_t local_188;
  uint local_184;
  uint *local_180;
  undefined4 local_174;
  BrotliBitReader *local_170;
  undefined4 local_168;
  uint32_t local_164;
  BrotliBitReader *local_160;
  BrotliBitReader *local_158;
  undefined4 local_14c;
  BrotliBitReader *local_148;
  uint32_t local_13c;
  BrotliBitReader *local_138;
  undefined4 local_12c;
  BrotliBitReader *local_128;
  undefined4 local_11c;
  BrotliBitReader *local_118;
  BrotliBitReader *local_110;
  uint local_104;
  BrotliBitReader *local_100;
  uint local_f4;
  uint32_t *local_f0;
  undefined4 local_e4;
  BrotliBitReader *local_e0;
  int local_d4;
  undefined4 local_d0;
  uint32_t local_cc;
  BrotliBitReader *local_c8;
  BrotliBitReader *local_c0;
  BrotliBitReader *local_b8;
  uint local_b0;
  uint local_ac;
  uint32_t *puStack_a8;
  uint32_t val;
  BrotliBitReader *local_a0;
  HuffmanCode *local_98;
  int local_8c;
  uint *local_88;
  undefined4 local_7c;
  BrotliBitReader *local_78;
  int local_6c;
  undefined4 local_68;
  uint32_t local_64;
  BrotliBitReader *local_60;
  BrotliBitReader *local_58;
  BrotliBitReader *local_50;
  uint local_48;
  uint local_44;
  BrotliBitReader *pBStack_40;
  uint32_t nbits;
  HuffmanCode *local_38;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  BrotliBitReader *local_20;
  undefined4 local_14;
  BrotliBitReader *local_10;
  
  _bits = &s->br;
  context_index = 1;
  br = (BrotliBitReader *)s;
  s_local = (BrotliDecoderStateInternal *)context_map_arg;
  context_map_arg_local = (uint8_t **)num_htrees;
  num_htrees_local._0_4_ = context_map_size;
  switch(s->substate_context_map) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    context_index = DecodeVarLenUint8(s,_bits,num_htrees);
    if (context_index != BROTLI_DECODER_SUCCESS) {
      return context_index;
    }
    *(int *)context_map_arg_local = *(int *)context_map_arg_local + 1;
    *(undefined4 *)&br[0x44].next_in = 0;
    uVar2 = (**(code **)&br[1].bit_pos_)(br[1].avail_in);
    s_local->state = (int)uVar2;
    s_local->loop_counter = (int)((ulong)uVar2 >> 0x20);
    lVar1._0_4_ = s_local->state;
    lVar1._4_4_ = s_local->loop_counter;
    if (lVar1 == 0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*(uint *)context_map_arg_local < 2) {
      memset(*(void **)s_local,0,(ulong)(uint32_t)num_htrees_local);
      return BROTLI_DECODER_SUCCESS;
    }
    *(undefined4 *)((long)&br[0x9e].next_in + 4) = 1;
  case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX:
    local_e0 = _bits;
    local_e4 = 5;
    local_f0 = &max_run_length_prefix;
    do {
      local_c8 = _bits;
      if (4 < 0x40 - _bits->bit_pos_) {
        local_c0 = _bits;
        local_d0 = 5;
        local_cc = 0x1f;
        max_run_length_prefix = (uint)(_bits->val_ >> ((byte)_bits->bit_pos_ & 0x3f)) & 0x1f;
        local_d4 = 1;
        goto LAB_0010648f;
      }
      local_b8 = _bits;
      bVar4 = _bits->avail_in != 0;
      if (bVar4) {
        _bits->val_ = _bits->val_ >> 8;
        _bits->val_ = (ulong)*_bits->next_in << 0x38 | _bits->val_;
        _bits->bit_pos_ = _bits->bit_pos_ - 8;
        _bits->avail_in = _bits->avail_in - 1;
        _bits->next_in = _bits->next_in + 1;
      }
      local_b0 = (uint)bVar4;
    } while (local_b0 != 0);
    local_d4 = 0;
LAB_0010648f:
    if (local_d4 == 0) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if ((max_run_length_prefix & 1) == 0) {
      *(undefined4 *)((long)&br[0x44].next_in + 4) = 0;
      local_128 = _bits;
      local_12c = 1;
      _bits->bit_pos_ = _bits->bit_pos_ + 1;
    }
    else {
      *(uint32_t *)((long)&br[0x44].next_in + 4) = (max_run_length_prefix >> 1) + 1;
      local_118 = _bits;
      local_11c = 5;
      _bits->bit_pos_ = _bits->bit_pos_ + 5;
    }
    *(undefined4 *)((long)&br[0x9e].next_in + 4) = 2;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    num_htrees_local._4_4_ =
         ReadHuffmanCode(*(int *)context_map_arg_local + *(int *)((long)&br[0x44].next_in + 4),
                         (HuffmanCode *)((long)&br[0x44].avail_in + 4),(uint32_t *)0x0,
                         (BrotliDecoderStateInternal *)br);
    if (num_htrees_local._4_4_ == BROTLI_DECODER_SUCCESS) {
      *(undefined4 *)&br[0x44].avail_in = 0xffff;
      *(undefined4 *)((long)&br[0x9e].next_in + 4) = 3;
switchD_00106235_caseD_3:
      context_index = 1;
      context_map._4_4_ = *(uint *)&br[0x44].next_in;
      context_map._0_4_ = *(uint *)((long)&br[0x44].next_in + 4);
      reps = s_local->state;
      unique0x00012004 = s_local->loop_counter;
      bits_1 = (uint32_t)br[0x44].avail_in;
      if (bits_1 == 0xffff) goto LAB_0010661a;
LAB_0010694f:
      local_1c0 = _bits;
      local_1c4 = bits_1;
      local_1d0 = &local_238;
      do {
        local_1b0 = _bits;
        if (bits_1 <= 0x40 - _bits->bit_pos_) {
          local_190 = _bits;
          local_194 = bits_1;
          local_158 = _bits;
          local_188 = bits_1;
          local_184 = kBitMask[bits_1];
          local_238 = (uint)(_bits->val_ >> ((byte)_bits->bit_pos_ & 0x3f)) & local_184;
          local_138 = _bits;
          local_13c = bits_1;
          _bits->bit_pos_ = bits_1 + _bits->bit_pos_;
          local_1b4 = 1;
          local_1a0 = local_1d0;
          goto LAB_00106b1a;
        }
        local_110 = _bits;
        bVar4 = _bits->avail_in != 0;
        if (bVar4) {
          _bits->val_ = _bits->val_ >> 8;
          _bits->val_ = (ulong)*_bits->next_in << 0x38 | _bits->val_;
          _bits->bit_pos_ = _bits->bit_pos_ - 8;
          _bits->avail_in = _bits->avail_in - 1;
          _bits->next_in = _bits->next_in + 1;
        }
        local_104 = (uint)bVar4;
      } while (local_104 != 0);
      local_1b4 = 0;
LAB_00106b1a:
      if (local_1b4 == 0) {
        *(uint32_t *)&br[0x44].avail_in = bits_1;
        *(uint *)&br[0x44].next_in = context_map._4_4_;
        num_htrees_local._4_4_ = BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      else {
        local_238 = (1 << ((byte)bits_1 & 0x1f)) + local_238;
        if (context_map._4_4_ + local_238 <= (uint32_t)num_htrees_local) {
          do {
            uVar3 = context_map._4_4_ + 1;
            *(undefined1 *)(_reps + (ulong)context_map._4_4_) = 0;
            local_238 = local_238 - 1;
            context_map._4_4_ = uVar3;
          } while (local_238 != 0);
          local_238 = 0;
LAB_0010661a:
          do {
            if ((uint32_t)num_htrees_local <= context_map._4_4_) goto switchD_00106235_caseD_4;
            local_98 = (HuffmanCode *)((long)&br[0x44].avail_in + 4);
            local_a0 = _bits;
            puStack_a8 = &bits_1;
            local_78 = _bits;
            local_7c = 0xf;
            local_88 = &local_ac;
            do {
              local_60 = _bits;
              if (0xe < 0x40 - _bits->bit_pos_) {
                local_58 = _bits;
                local_68 = 0xf;
                local_64 = 0x7fff;
                local_ac = (uint)(_bits->val_ >> ((byte)_bits->bit_pos_ & 0x3f)) & 0x7fff;
                local_6c = 1;
                goto LAB_00106771;
              }
              local_50 = _bits;
              bVar4 = _bits->avail_in != 0;
              if (bVar4) {
                _bits->val_ = _bits->val_ >> 8;
                _bits->val_ = (ulong)*_bits->next_in << 0x38 | _bits->val_;
                _bits->bit_pos_ = _bits->bit_pos_ - 8;
                _bits->avail_in = _bits->avail_in - 1;
                _bits->next_in = _bits->next_in + 1;
              }
              local_48 = (uint)bVar4;
            } while (local_48 != 0);
            local_6c = 0;
LAB_00106771:
            if (local_6c == 0) {
              local_8c = SafeDecodeSymbol(local_98,_bits,puStack_a8);
            }
            else {
              local_30 = local_ac;
              pBStack_40 = _bits;
              local_38 = local_98 + (local_ac & 0xff);
              if (8 < local_38->bits) {
                local_44 = local_38->bits - 8;
                local_10 = _bits;
                local_14 = 8;
                _bits->bit_pos_ = _bits->bit_pos_ + 8;
                local_28 = kBitMask[local_44];
                local_38 = local_38 +
                           (long)(int)(uint)local_38->value + (ulong)(local_ac >> 8 & local_28);
                local_2c = local_44;
              }
              local_20 = _bits;
              local_24 = (uint)local_38->bits;
              _bits->bit_pos_ = local_24 + _bits->bit_pos_;
              bits_1 = (uint32_t)local_38->value;
              local_8c = 1;
            }
            if (local_8c == 0) {
              *(undefined4 *)&br[0x44].avail_in = 0xffff;
              *(uint *)&br[0x44].next_in = context_map._4_4_;
              return BROTLI_DECODER_NEEDS_MORE_INPUT;
            }
            if (bits_1 != 0) {
              if ((uint)context_map < bits_1) {
                *(char *)(_reps + (ulong)context_map._4_4_) = (char)bits_1 - (char)(uint)context_map
                ;
                context_map._4_4_ = context_map._4_4_ + 1;
                goto LAB_0010661a;
              }
              goto LAB_0010694f;
            }
            *(undefined1 *)(_reps + (ulong)context_map._4_4_) = 0;
            context_map._4_4_ = context_map._4_4_ + 1;
          } while( true );
        }
        num_htrees_local._4_4_ = BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
      }
    }
    break;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    goto switchD_00106235_caseD_3;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
switchD_00106235_caseD_4:
    local_1e0 = _bits;
    local_1e4 = 1;
    _context_map_size_local = &local_23c;
    do {
      local_1a8 = _bits;
      if (_bits->bit_pos_ != 0x40) {
        local_170 = _bits;
        local_174 = 1;
        local_160 = _bits;
        local_168 = 1;
        local_164 = 1;
        local_23c = (uint)(_bits->val_ >> ((byte)_bits->bit_pos_ & 0x3f)) & 1;
        local_148 = _bits;
        local_14c = 1;
        _bits->bit_pos_ = _bits->bit_pos_ + 1;
        local_1d4 = 1;
        local_180 = _context_map_size_local;
        goto LAB_00106d98;
      }
      local_100 = _bits;
      bVar4 = _bits->avail_in != 0;
      if (bVar4) {
        _bits->val_ = _bits->val_ >> 8;
        _bits->val_ = (ulong)*_bits->next_in << 0x38 | _bits->val_;
        _bits->bit_pos_ = _bits->bit_pos_ - 8;
        _bits->avail_in = _bits->avail_in - 1;
        _bits->next_in = _bits->next_in + 1;
      }
      local_f4 = (uint)bVar4;
    } while (local_f4 != 0);
    local_1d4 = 0;
LAB_00106d98:
    if (local_1d4 == 0) {
      *(undefined4 *)((long)&br[0x9e].next_in + 4) = 4;
      num_htrees_local._4_4_ = BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    else {
      if (local_23c != 0) {
        InverseMoveToFrontTransform
                  (*(uint8_t **)s_local,(uint32_t)num_htrees_local,(BrotliDecoderStateInternal *)br)
        ;
      }
      *(undefined4 *)((long)&br[0x9e].next_in + 4) = 0;
      num_htrees_local._4_4_ = BROTLI_DECODER_SUCCESS;
    }
    break;
  default:
    num_htrees_local._4_4_ = BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  return num_htrees_local._4_4_;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(uint32_t context_map_size,
                                               uint32_t* num_htrees,
                                               uint8_t** context_map_arg,
                                               BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;

  switch ((int)s->substate_context_map) {
    case BROTLI_STATE_CONTEXT_MAP_NONE:
      result = DecodeVarLenUint8(s, br, num_htrees);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      (*num_htrees)++;
      s->context_index = 0;
      BROTLI_LOG_UINT(context_map_size);
      BROTLI_LOG_UINT(*num_htrees);
      *context_map_arg = (uint8_t*)BROTLI_ALLOC(s, (size_t)context_map_size);
      if (*context_map_arg == 0) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
      }
      if (*num_htrees <= 1) {
        memset(*context_map_arg, 0, (size_t)context_map_size);
        return BROTLI_DECODER_SUCCESS;
      }
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
      /* No break, continue to next state. */
    case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
      uint32_t bits;
      /* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
         to peek 4 bits ahead. */
      if (!BrotliSafeGetBits(br, 5, &bits)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((bits & 1) != 0) { /* Use RLE for zeros. */
        s->max_run_length_prefix = (bits >> 1) + 1;
        BrotliDropBits(br, 5);
      } else {
        s->max_run_length_prefix = 0;
        BrotliDropBits(br, 1);
      }
      BROTLI_LOG_UINT(s->max_run_length_prefix);
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
      /* No break, continue to next state. */
    }
    case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
      result = ReadHuffmanCode(*num_htrees + s->max_run_length_prefix,
                               s->context_map_table, NULL, s);
      if (result != BROTLI_DECODER_SUCCESS) return result;
      s->code = 0xFFFF;
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
      /* No break, continue to next state. */
    case BROTLI_STATE_CONTEXT_MAP_DECODE: {
      uint32_t context_index = s->context_index;
      uint32_t max_run_length_prefix = s->max_run_length_prefix;
      uint8_t* context_map = *context_map_arg;
      uint32_t code = s->code;
      if (code != 0xFFFF) {
        goto rleCode;
      }
      while (context_index < context_map_size) {
        if (!SafeReadSymbol(s->context_map_table, br, &code)) {
          s->code = 0xFFFF;
          s->context_index = context_index;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        BROTLI_LOG_UINT(code);

        if (code == 0) {
          context_map[context_index++] = 0;
          continue;
        }
        if (code > max_run_length_prefix) {
          context_map[context_index++] =
              (uint8_t)(code - max_run_length_prefix);
          continue;
        }
rleCode:
        {
          uint32_t reps;
          if (!BrotliSafeReadBits(br, code, &reps)) {
            s->code = code;
            s->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          reps += 1U << code;
          BROTLI_LOG_UINT(reps);
          if (context_index + reps > context_map_size) {
            return
                BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
          }
          do {
            context_map[context_index++] = 0;
          } while (--reps);
        }
      }
      /* No break, continue to next state. */
    }
    case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
      uint32_t bits;
      if (!BrotliSafeReadBits(br, 1, &bits)) {
        s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits != 0) {
        InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
      }
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }
    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}